

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall duckdb::Executor::AddEvent(Executor *this,shared_ptr<duckdb::Event,_true> *event)

{
  ::std::mutex::lock(&this->executor_lock);
  if (this->cancelled == false) {
    ::std::
    vector<duckdb::shared_ptr<duckdb::Event,true>,std::allocator<duckdb::shared_ptr<duckdb::Event,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Event,true>>
              ((vector<duckdb::shared_ptr<duckdb::Event,true>,std::allocator<duckdb::shared_ptr<duckdb::Event,true>>>
                *)&this->events,event);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
  return;
}

Assistant:

void Executor::AddEvent(shared_ptr<Event> event) {
	lock_guard<mutex> elock(executor_lock);
	if (cancelled) {
		return;
	}
	events.push_back(std::move(event));
}